

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

bool __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicObject *object,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int initialPropertyCount;
  DynamicType *pDVar6;
  DynamicTypeHandler *pDVar7;
  DynamicObject *pDVar8;
  undefined4 *puVar9;
  ScriptContext **ppSVar10;
  ThreadContext *pTVar11;
  Recycler *pRVar12;
  CachedData *pCVar13;
  WriteBarrierPtr<Js::PropertyString> **ppWVar14;
  int *ptr;
  int **ppiVar15;
  BigPropertyIndex local_a4;
  TrackAllocData local_80;
  uint local_54;
  CachedData *pCStack_50;
  uint propertyCount;
  CachedData *data;
  DynamicType *type;
  EnumeratorCache *local_38;
  EnumeratorCache *enumeratorCache_local;
  ScriptContext *requestContext_local;
  DynamicObject *pDStack_20;
  EnumeratorFlags flags_local;
  DynamicObject *object_local;
  DynamicObjectPropertyEnumerator *this_local;
  
  local_38 = enumeratorCache;
  enumeratorCache_local = (EnumeratorCache *)requestContext;
  requestContext_local._7_1_ = flags;
  pDStack_20 = object;
  object_local = (DynamicObject *)this;
  Memory::WriteBarrierPtr<Js::ScriptContext>::operator=(&this->scriptContext,requestContext);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->object,pDStack_20);
  this->flags = requestContext_local._7_1_;
  if (pDStack_20 == (DynamicObject *)0x0) {
    type = (DynamicType *)0x0;
    Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator=
              (&this->cachedData,&type);
    this_local._7_1_ = true;
  }
  else {
    this->objectIndex = -1;
    this->enumeratedCount = 0;
    bVar4 = GetUseCache(this);
    if (bVar4) {
      data = (CachedData *)DynamicObject::GetDynamicType(pDStack_20);
      if ((local_38 != (EnumeratorCache *)0x0) &&
         ((DynamicType *)data == (DynamicType *)local_38->type)) {
        pCStack_50 = (CachedData *)local_38->data;
        if (pCStack_50 == (CachedData *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                      ,0x49,"(data != nullptr)","data != nullptr");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                             ((WriteBarrierPtr *)pCStack_50);
        pSVar2 = *ppSVar10;
        ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                             ((WriteBarrierPtr *)this);
        if (pSVar2 != *ppSVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                      ,0x4a,"(data->scriptContext == this->scriptContext)",
                                      "data->scriptContext == this->scriptContext");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        TVar1 = pCStack_50->enumNonEnumerable;
        bVar4 = GetEnumNonEnumerable(this);
        if (((bool)(TVar1 & 1U) == bVar4) &&
           (TVar1 = pCStack_50->enumSymbols, bVar4 = GetEnumSymbols(this),
           (bool)(TVar1 & 1U) == bVar4)) {
          Initialize(this,(DynamicType *)data,pCStack_50,pCStack_50->propertyCount);
          return true;
        }
      }
      pTVar11 = ScriptContext::GetThreadContext((ScriptContext *)enumeratorCache_local);
      pCStack_50 = (CachedData *)
                   ThreadContext::GetDynamicObjectEnumeratorCache(pTVar11,(DynamicType *)data);
      if (pCStack_50 != (CachedData *)0x0) {
        ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                             ((WriteBarrierPtr *)pCStack_50);
        pSVar2 = *ppSVar10;
        ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                             ((WriteBarrierPtr *)this);
        if (((pSVar2 == *ppSVar10) &&
            (TVar1 = pCStack_50->enumNonEnumerable, bVar4 = GetEnumNonEnumerable(this),
            (bool)(TVar1 & 1U) == bVar4)) &&
           (TVar1 = pCStack_50->enumSymbols, bVar4 = GetEnumSymbols(this),
           (bool)(TVar1 & 1U) == bVar4)) {
          Initialize(this,(DynamicType *)data,pCStack_50,pCStack_50->propertyCount);
          if (local_38 != (EnumeratorCache *)0x0) {
            local_38->type = (Type *)data;
            local_38->data = pCStack_50;
          }
          return true;
        }
      }
      pDVar6 = DynamicObject::GetDynamicType(pDStack_20);
      pDVar7 = DynamicType::GetTypeHandler(pDVar6);
      uVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x10])(pDVar7,pDStack_20);
      if ((uVar5 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        data = (CachedData *)DynamicObject::GetDynamicType(pDStack_20);
        bVar4 = DynamicType::PrepareForTypeSnapshotEnumeration((DynamicType *)data);
        pCVar13 = data;
        if (bVar4) {
          pDVar8 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->(&this->object);
          local_54 = DynamicObject::GetPropertyCountForEnum(pDVar8);
          pRVar12 = ScriptContext::GetRecycler((ScriptContext *)enumeratorCache_local);
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_80,(type_info *)&CachedData::typeinfo,(ulong)local_54 * 0xd,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                     ,0x70);
          pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_80);
          pCVar13 = (CachedData *)new<Memory::Recycler>(0x30,pRVar12,0x446fd0,0);
          CachedData::CachedData(pCVar13);
          pCStack_50 = pCVar13;
          Memory::WriteBarrierPtr<Js::ScriptContext>::operator=
                    ((WriteBarrierPtr<Js::ScriptContext> *)pCVar13,
                     (ScriptContext *)enumeratorCache_local);
          pCStack_50->cachedCount = 0;
          pCStack_50->propertyCount = local_54;
          Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::PropertyString>_>::operator=
                    (&pCStack_50->strings,(WriteBarrierPtr<Js::PropertyString> *)(pCStack_50 + 1));
          ppWVar14 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                               ((WriteBarrierPtr *)&pCStack_50->strings);
          ptr = unsafe_write_barrier_cast<int*,Memory::WriteBarrierPtr<Js::PropertyString>*>
                          (*ppWVar14 + local_54);
          Memory::WriteBarrierPtr<int>::operator=(&pCStack_50->indexes,ptr);
          ppiVar15 = Memory::WriteBarrierPtr::operator_cast_to_int__
                               ((WriteBarrierPtr *)&pCStack_50->indexes);
          Memory::WriteBarrierPtr<unsigned_char>::operator=
                    (&pCStack_50->attributes,(uchar *)(*ppiVar15 + local_54));
          pCStack_50->completed = false;
          bVar4 = GetEnumNonEnumerable(this);
          pCStack_50->enumNonEnumerable = bVar4;
          bVar4 = GetEnumSymbols(this);
          pCStack_50->enumSymbols = bVar4;
          pTVar11 = ScriptContext::GetThreadContext((ScriptContext *)enumeratorCache_local);
          ThreadContext::AddDynamicObjectEnumeratorCache(pTVar11,(DynamicType *)data,pCStack_50);
          Initialize(this,(DynamicType *)data,pCStack_50,local_54);
          if (local_38 != (EnumeratorCache *)0x0) {
            local_38->type = (Type *)data;
            local_38->data = pCStack_50;
          }
          this_local._7_1_ = true;
        }
        else {
          initialPropertyCount =
               (*(pDStack_20->super_RecyclableObject).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
          Initialize(this,(DynamicType *)pCVar13,(CachedData *)0x0,initialPropertyCount);
          this_local._7_1_ = true;
        }
      }
    }
    else {
      pDVar6 = DynamicObject::GetDynamicType(pDStack_20);
      pDVar7 = DynamicType::GetTypeHandler(pDVar6);
      uVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x10])(pDVar7,pDStack_20);
      if ((uVar5 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        pDVar6 = DynamicObject::GetDynamicType(pDStack_20);
        bVar4 = GetSnapShotSemantics(this);
        if (bVar4) {
          pDVar8 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->(&this->object);
          local_a4 = (*(pDVar8->super_RecyclableObject).super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
        }
        else {
          local_a4 = -1;
        }
        Initialize(this,pDVar6,(CachedData *)0x0,local_a4);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicObjectPropertyEnumerator::Initialize(DynamicObject * object, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->scriptContext = requestContext;
        this->object = object;
        this->flags = flags;

        if (!object)
        {
            this->cachedData = nullptr;
            return true;
        }

        this->objectIndex = Constants::NoBigSlot;
        this->enumeratedCount = 0;

        if (!GetUseCache())
        {
            if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
            {
                return false;
            }
            Initialize(object->GetDynamicType(), nullptr, GetSnapShotSemantics() ? this->object->GetPropertyCount() : Constants::NoBigSlot);
            return true;
        }

        DynamicType * type = object->GetDynamicType();

        CachedData * data;
        if (enumeratorCache && type == enumeratorCache->type)
        {
            data = (CachedData *)enumeratorCache->data;

            Assert(data != nullptr);
            Assert(data->scriptContext == this->scriptContext); // The cache data script context should be the same as request context

            if (data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
            {
                Initialize(type, data, data->propertyCount);
                return true;
            }
        }

        data = (CachedData *)requestContext->GetThreadContext()->GetDynamicObjectEnumeratorCache(type);

        if (data != nullptr && data->scriptContext == this->scriptContext && data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
        {
            Initialize(type, data, data->propertyCount);

            if (enumeratorCache)
            {
                enumeratorCache->type = type;
                enumeratorCache->data = data;
            }
            return true;
        }

        if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
        {
            return false;
        }

        // Reload the type after EnsureObjectReady
        type = object->GetDynamicType();
        if (!type->PrepareForTypeSnapshotEnumeration())
        {
            Initialize(type, nullptr, object->GetPropertyCount());
            return true;
        }

        uint propertyCount = this->object->GetPropertyCountForEnum();
        data = RecyclerNewStructPlus(requestContext->GetRecycler(),
            propertyCount * sizeof(Field(PropertyString*)) + propertyCount * sizeof(BigPropertyIndex) + propertyCount * sizeof(PropertyAttributes), CachedData);
        data->scriptContext = requestContext;
        data->cachedCount = 0;
        data->propertyCount = propertyCount;
        data->strings = reinterpret_cast<Field(PropertyString*)*>(data + 1);
        data->indexes = unsafe_write_barrier_cast<BigPropertyIndex *>(data->strings + propertyCount);
        data->attributes = (PropertyAttributes*)(data->indexes + propertyCount);
        data->completed = false;
        data->enumNonEnumerable = GetEnumNonEnumerable();
        data->enumSymbols = GetEnumSymbols();
        requestContext->GetThreadContext()->AddDynamicObjectEnumeratorCache(type, data);
        Initialize(type, data, propertyCount);

        if (enumeratorCache)
        {
            enumeratorCache->type = type;
            enumeratorCache->data = data;
        }
        return true;
    }